

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetParametersTest::TestCustomFramebuffer
          (GetParametersTest *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  Enum<int,_2UL> EVar6;
  MessageBuilder local_360;
  GetNameFunc local_1e0;
  int local_1d8;
  Enum<int,_2UL> local_1d0 [2];
  MessageBuilder local_1b0;
  int local_30;
  GLenum local_2c;
  GLenum error;
  GLint parameter_dsa;
  GLint parameter_legacy;
  GLuint i;
  GLuint pnames_count;
  bool is_ok;
  Functions *gl;
  GetParametersTest *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _pnames_count = CONCAT44(extraout_var,iVar1);
  i._3_1_ = 1;
  parameter_legacy = 0xb;
  for (parameter_dsa = 0; (uint)parameter_dsa < (uint)parameter_legacy;
      parameter_dsa = parameter_dsa + 1) {
    error = 0;
    local_2c = 0;
    (**(code **)(_pnames_count + 0x838))
              (0x8d40,TestCustomFramebuffer::pnames[(uint)parameter_dsa],&error);
    err = (**(code **)(_pnames_count + 0x800))();
    glu::checkError(err,"glGetFramebufferParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0xf23);
    (**(code **)(_pnames_count + 0x918))
              (this->m_fbo,TestCustomFramebuffer::pnames[(uint)parameter_dsa],&local_2c);
    local_30 = (**(code **)(_pnames_count + 0x800))();
    if (local_30 == 0) {
      if (error != local_2c) {
        pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar4 = tcu::TestContext::getLog(pTVar3);
        tcu::TestLog::operator<<(&local_360,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_360,(char (*) [41])"GetNamedFramebufferParameteriv returned ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&local_2c);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0x2a796ef);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&error);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [19])" was expected for ");
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,TestCustomFramebuffer::pnames_strings + (uint)parameter_dsa);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [39])" parameter name of framebuffer object.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_360);
        i._3_1_ = 0;
      }
    }
    else {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_1b0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_1b0,
                          (char (*) [55])"GetNamedFramebufferParameteriv unexpectedly generated ");
      EVar6 = glu::getErrorStr(local_30);
      local_1e0 = EVar6.m_getName;
      local_1d8 = EVar6.m_value;
      local_1d0[0].m_getName = local_1e0;
      local_1d0[0].m_value = local_1d8;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1d0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [25])" error when called with ");
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,TestCustomFramebuffer::pnames_strings + (uint)parameter_dsa);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(char (*) [40])" parameter name for framebuffer object.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
      i._3_1_ = 0;
    }
  }
  return (bool)(i._3_1_ & 1);
}

Assistant:

bool GetParametersTest::TestCustomFramebuffer()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	static const glw::GLenum pnames[] = { GL_DOUBLEBUFFER,
										  GL_IMPLEMENTATION_COLOR_READ_FORMAT,
										  GL_IMPLEMENTATION_COLOR_READ_TYPE,
										  GL_SAMPLES,
										  GL_SAMPLE_BUFFERS,
										  GL_STEREO,
										  GL_FRAMEBUFFER_DEFAULT_WIDTH,
										  GL_FRAMEBUFFER_DEFAULT_HEIGHT,
										  GL_FRAMEBUFFER_DEFAULT_LAYERS,
										  GL_FRAMEBUFFER_DEFAULT_SAMPLES,
										  GL_FRAMEBUFFER_DEFAULT_FIXED_SAMPLE_LOCATIONS };

	static const glw::GLchar* pnames_strings[] = { "GL_DOUBLEBUFFER",
												   "GL_IMPLEMENTATION_COLOR_READ_FORMAT",
												   "GL_IMPLEMENTATION_COLOR_READ_TYPE",
												   "GL_SAMPLES",
												   "GL_SAMPLE_BUFFERS",
												   "GL_STEREO",
												   "FRAMEBUFFER_DEFAULT_WIDTH",
												   "FRAMEBUFFER_DEFAULT_HEIGHT",
												   "FRAMEBUFFER_DEFAULT_LAYERS",
												   "FRAMEBUFFER_DEFAULT_SAMPLES",
												   "FRAMEBUFFER_DEFAULT_FIXED_SAMPLE_LOCATIONS" };

	glw::GLuint pnames_count = sizeof(pnames) / sizeof(pnames[0]);

	for (glw::GLuint i = 0; i < pnames_count; ++i)
	{
		glw::GLint parameter_legacy = 0;
		glw::GLint parameter_dsa	= 0;

		gl.getFramebufferParameteriv(GL_FRAMEBUFFER, pnames[i], &parameter_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

		gl.getNamedFramebufferParameteriv(m_fbo, pnames[i], &parameter_dsa);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferParameteriv unexpectedly generated "
				<< glu::getErrorStr(error) << " error when called with " << pnames_strings[i]
				<< " parameter name for framebuffer object." << tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_legacy != parameter_dsa)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetNamedFramebufferParameteriv returned "
												<< parameter_dsa << ", but " << parameter_legacy << " was expected for "
												<< pnames_strings[i] << " parameter name of framebuffer object."
												<< tcu::TestLog::EndMessage;

			is_ok = false;
		}
	}

	return is_ok;
}